

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressDXT.cpp
# Opt level: O0

void __thiscall nv::FastCompressor::compressDXT5(FastCompressor *this,Private *outputOptions)

{
  uint uVar1;
  uint uVar2;
  uint local_78;
  uint local_74;
  uint x;
  uint y;
  BlockDXT5 block;
  ColorBlock rgba;
  uint h;
  uint w;
  Private *outputOptions_local;
  FastCompressor *this_local;
  
  uVar1 = Image::width(this->m_image);
  uVar2 = Image::height(this->m_image);
  ColorBlock::ColorBlock((ColorBlock *)&block.color);
  BlockDXT5::BlockDXT5((BlockDXT5 *)&x);
  for (local_74 = 0; local_74 < uVar2; local_74 = local_74 + 4) {
    for (local_78 = 0; local_78 < uVar1; local_78 = local_78 + 4) {
      ColorBlock::init((ColorBlock *)&block.color,(EVP_PKEY_CTX *)this->m_image);
      QuickCompress::compressDXT5((ColorBlock *)&block.color,(BlockDXT5 *)&x,0);
      if (outputOptions->outputHandler != (OutputHandler *)0x0) {
        (*outputOptions->outputHandler->_vptr_OutputHandler[3])
                  (outputOptions->outputHandler,&x,0x10);
      }
    }
  }
  return;
}

Assistant:

void nv::FastCompressor::compressDXT5(const nvtt::OutputOptions::Private & outputOptions)
{
	const uint w = m_image->width();
	const uint h = m_image->height();
	
	ColorBlock rgba;
	BlockDXT5 block;

	for (uint y = 0; y < h; y += 4) {
		for (uint x = 0; x < w; x += 4) {
			rgba.init(m_image, x, y);
			
			QuickCompress::compressDXT5(rgba, &block, 0);
			
			if (outputOptions.outputHandler != NULL) {
				outputOptions.outputHandler->writeData(&block, sizeof(block));
			}
		}
	}
}